

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
::dispose(Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
          *this)

{
  Impl<kj::MainBuilder::MainImpl> *object;
  Impl<kj::MainBuilder::MainImpl> *ptrCopy;
  Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
  *this_local;
  
  object = this->ptr;
  if (object != (Impl<kj::MainBuilder::MainImpl> *)0x0) {
    this->ptr = (Impl<kj::MainBuilder::MainImpl> *)0x0;
    Disposer::
    dispose<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>::Impl<kj::MainBuilder::MainImpl>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }